

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge.hh
# Opt level: O0

edge_const_shared_ptr_t __thiscall tchecker::system::edges_t::edge(edges_t *this,edge_id_t edge_id)

{
  size_type sVar1;
  const_reference __r;
  uint in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  edge_const_shared_ptr_t eVar2;
  edge_id_t edge_id_local;
  edges_t *this_local;
  
  sVar1 = std::
          vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
          ::size((vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
                  *)CONCAT44(in_register_00000034,edge_id));
  if (in_EDX < sVar1) {
    __r = std::
          vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
          ::operator[]((vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
                        *)CONCAT44(in_register_00000034,edge_id),(ulong)in_EDX);
    std::shared_ptr<tchecker::system::edge_t_const>::shared_ptr<tchecker::system::edge_t,void>
              ((shared_ptr<tchecker::system::edge_t_const> *)this,__r);
    eVar2.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = extraout_RDX._M_pi;
    eVar2.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (edge_const_shared_ptr_t)
           eVar2.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("edge_id < _edges.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/system/edge.hh"
                ,0x171,
                "tchecker::system::edge_const_shared_ptr_t tchecker::system::edges_t::edge(tchecker::edge_id_t) const"
               );
}

Assistant:

inline tchecker::system::edge_const_shared_ptr_t edge(tchecker::edge_id_t edge_id) const
  {
    assert(edge_id < _edges.size());
    return _edges[edge_id];
  }